

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O3

boolean encode_mcu_huff(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  uint uVar2;
  undefined4 uVar3;
  jpeg_destination_mgr *pjVar4;
  j_compress_ptr pjVar5;
  boolean bVar6;
  JOCTET *pJVar7;
  uint uVar8;
  jpeg_entropy_encoder *pjVar9;
  JOCTET *__n;
  JOCTET *pJVar10;
  long lVar11;
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  JOCTET _buffer [512];
  undefined1 local_290 [28];
  int iStack_274;
  undefined8 local_270;
  _func_void_j_compress_ptr_boolean *p_Stack_268;
  j_compress_ptr local_260;
  int local_258;
  jpeg_entropy_encoder *local_250;
  JBLOCKROW *local_248;
  j_compress_ptr local_240;
  JOCTET local_238 [520];
  long lVar15;
  
  pjVar9 = cinfo->entropy;
  local_290._0_8_ = cinfo->dest->next_output_byte;
  local_290._8_8_ = cinfo->dest->free_in_buffer;
  local_290._16_8_ = *(anon_union_8_2_c960f3a9_for_put_buffer *)(pjVar9 + 1);
  unique0x10000231 = pjVar9[1].encode_mcu;
  local_270 = pjVar9[1].finish_pass;
  p_Stack_268 = pjVar9[2].start_pass;
  local_260 = cinfo;
  local_258 = *(int *)&pjVar9[8].start_pass;
  local_250 = pjVar9;
  if ((cinfo->restart_interval != 0) && (*(int *)&pjVar9[2].encode_mcu == 0)) {
    uVar3 = *(undefined4 *)((long)&pjVar9[2].encode_mcu + 4);
    bVar6 = flush_bits((working_state *)local_290);
    pjVar5 = local_260;
    if (bVar6 == 0) {
      return 0;
    }
    *(JOCTET *)local_290._0_8_ = 0xff;
    pJVar7 = (JOCTET *)(local_290._8_8_ + -1);
    if (pJVar7 == (JOCTET *)0x0) {
      pjVar4 = local_260->dest;
      bVar6 = (*pjVar4->empty_output_buffer)(local_260);
      if (bVar6 == 0) {
        return 0;
      }
      pJVar10 = pjVar4->next_output_byte;
      pJVar7 = (JOCTET *)pjVar4->free_in_buffer;
    }
    else {
      pJVar10 = (JOCTET *)(local_290._0_8_ + 1);
    }
    pjVar9 = local_250;
    local_290._0_8_ = pJVar10 + 1;
    *pJVar10 = (char)uVar3 + 0xd0;
    local_290._8_8_ = pJVar7 + -1;
    if ((JOCTET *)local_290._8_8_ == (JOCTET *)0x0) {
      pjVar4 = pjVar5->dest;
      bVar6 = (*pjVar4->empty_output_buffer)(pjVar5);
      if (bVar6 == 0) {
        return 0;
      }
      local_290._0_8_ = pjVar4->next_output_byte;
      local_290._8_8_ = pjVar4->free_in_buffer;
    }
    iVar1 = pjVar5->comps_in_scan;
    if (0 < (long)iVar1) {
      lVar11 = (long)iVar1 + -1;
      auVar12._8_4_ = (int)lVar11;
      auVar12._0_8_ = lVar11;
      auVar12._12_4_ = (int)((ulong)lVar11 >> 0x20);
      lVar11 = 0;
      auVar12 = auVar12 ^ _DAT_00158050;
      auVar14 = _DAT_00158040;
      auVar16 = _DAT_00158000;
      do {
        auVar17 = auVar16 ^ _DAT_00158050;
        iVar13 = auVar12._4_4_;
        if ((bool)(~(auVar17._4_4_ == iVar13 && auVar12._0_4_ < auVar17._0_4_ ||
                    iVar13 < auVar17._4_4_) & 1)) {
          *(undefined4 *)((long)&iStack_274 + lVar11) = 0;
        }
        if ((auVar17._12_4_ != auVar12._12_4_ || auVar17._8_4_ <= auVar12._8_4_) &&
            auVar17._12_4_ <= auVar12._12_4_) {
          *(undefined4 *)((long)&local_270 + lVar11) = 0;
        }
        iVar18 = SUB164(auVar14 ^ _DAT_00158050,4);
        if (iVar18 <= iVar13 &&
            (iVar18 != iVar13 || SUB164(auVar14 ^ _DAT_00158050,0) <= auVar12._0_4_)) {
          *(undefined4 *)((long)&local_270 + lVar11 + 4) = 0;
          *(undefined4 *)((long)&p_Stack_268 + lVar11) = 0;
        }
        lVar15 = auVar16._8_8_;
        auVar16._0_8_ = auVar16._0_8_ + 4;
        auVar16._8_8_ = lVar15 + 4;
        lVar15 = auVar14._8_8_;
        auVar14._0_8_ = auVar14._0_8_ + 4;
        auVar14._8_8_ = lVar15 + 4;
        lVar11 = lVar11 + 0x10;
      } while ((ulong)(iVar1 + 3U >> 2) << 4 != lVar11);
    }
  }
  if (*(int *)&pjVar9[8].start_pass == 0) {
    if (0 < cinfo->blocks_in_MCU) {
      lVar11 = 0;
      do {
        iVar1 = cinfo->MCU_membership[lVar11];
        bVar6 = encode_one_block((working_state *)local_290,*MCU_data[lVar11],(&iStack_274)[iVar1],
                                 (c_derived_tbl *)
                                 (&pjVar9[2].finish_pass)[cinfo->cur_comp_info[iVar1]->dc_tbl_no],
                                 (c_derived_tbl *)
                                 (&pjVar9[4].start_pass)[cinfo->cur_comp_info[iVar1]->ac_tbl_no]);
        if (bVar6 == 0) {
          return 0;
        }
        (&iStack_274)[iVar1] = (int)(*MCU_data[lVar11])[0];
        lVar11 = lVar11 + 1;
      } while (lVar11 < cinfo->blocks_in_MCU);
    }
  }
  else if (0 < cinfo->blocks_in_MCU) {
    lVar11 = 0;
    local_240 = cinfo;
    local_248 = MCU_data;
    do {
      iVar1 = local_240->MCU_membership[lVar11];
      if ((ulong)local_290._8_8_ < (JOCTET *)0x200) {
        pJVar7 = jsimd_huff_encode_one_block
                           (local_290,local_238,*MCU_data[lVar11],(&iStack_274)[iVar1],
                            (c_derived_tbl *)
                            (&pjVar9[2].finish_pass)[local_240->cur_comp_info[iVar1]->dc_tbl_no],
                            (c_derived_tbl *)
                            (&pjVar9[4].start_pass)[local_240->cur_comp_info[iVar1]->ac_tbl_no]);
        pJVar7 = pJVar7 + -(long)local_238;
        if (pJVar7 != (JOCTET *)0x0) {
          pJVar10 = local_238;
          do {
            __n = (JOCTET *)local_290._8_8_;
            if (pJVar7 < (ulong)local_290._8_8_) {
              __n = pJVar7;
            }
            memcpy((void *)local_290._0_8_,pJVar10,(size_t)__n);
            local_290._0_8_ = local_290._0_8_ + (long)__n;
            local_290._8_8_ = local_290._8_8_ + -(long)__n;
            if ((JOCTET *)local_290._8_8_ == (JOCTET *)0x0) {
              pjVar4 = local_260->dest;
              bVar6 = (*pjVar4->empty_output_buffer)(local_260);
              if (bVar6 == 0) {
                return 0;
              }
              local_290._0_8_ = pjVar4->next_output_byte;
              local_290._8_8_ = pjVar4->free_in_buffer;
            }
            pJVar10 = pJVar10 + (long)__n;
            pJVar7 = pJVar7 + -(long)__n;
          } while (pJVar7 != (JOCTET *)0x0);
        }
      }
      else {
        pJVar7 = jsimd_huff_encode_one_block
                           (local_290,(JOCTET *)local_290._0_8_,*MCU_data[lVar11],
                            (&iStack_274)[iVar1],
                            (c_derived_tbl *)
                            (&pjVar9[2].finish_pass)[local_240->cur_comp_info[iVar1]->dc_tbl_no],
                            (c_derived_tbl *)
                            (&pjVar9[4].start_pass)[local_240->cur_comp_info[iVar1]->ac_tbl_no]);
        local_290._8_8_ = local_290._0_8_ + (local_290._8_8_ - (long)pJVar7);
        local_290._0_8_ = pJVar7;
      }
      MCU_data = local_248;
      (&iStack_274)[iVar1] = (int)(*local_248[lVar11])[0];
      lVar11 = lVar11 + 1;
      pjVar9 = local_250;
      cinfo = local_240;
    } while (lVar11 < local_240->blocks_in_MCU);
  }
  pjVar4 = cinfo->dest;
  pjVar4->next_output_byte = (JOCTET *)local_290._0_8_;
  pjVar4->free_in_buffer = local_290._8_8_;
  pjVar9[1].finish_pass = local_270;
  pjVar9[2].start_pass = p_Stack_268;
  *(undefined8 *)(pjVar9 + 1) = local_290._16_8_;
  pjVar9[1].encode_mcu = stack0xfffffffffffffd88;
  uVar2 = cinfo->restart_interval;
  if (uVar2 != 0) {
    uVar8 = *(uint *)&pjVar9[2].encode_mcu;
    if (*(uint *)&pjVar9[2].encode_mcu == 0) {
      *(uint *)((long)&pjVar9[2].encode_mcu + 4) =
           *(int *)((long)&pjVar9[2].encode_mcu + 4) + 1U & 7;
      uVar8 = uVar2;
    }
    *(uint *)&pjVar9[2].encode_mcu = uVar8 - 1;
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_huff(j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr)cinfo->entropy;
  working_state state;
  int blkn, ci;
  jpeg_component_info *compptr;

  /* Load up working state */
  state.next_output_byte = cinfo->dest->next_output_byte;
  state.free_in_buffer = cinfo->dest->free_in_buffer;
  state.cur = entropy->saved;
  state.cinfo = cinfo;
  state.simd = entropy->simd;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      if (!emit_restart(&state, entropy->next_restart_num))
        return FALSE;
  }

  /* Encode the MCU data blocks */
  if (entropy->simd) {
    for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
      ci = cinfo->MCU_membership[blkn];
      compptr = cinfo->cur_comp_info[ci];
      if (!encode_one_block_simd(&state,
                                 MCU_data[blkn][0], state.cur.last_dc_val[ci],
                                 entropy->dc_derived_tbls[compptr->dc_tbl_no],
                                 entropy->ac_derived_tbls[compptr->ac_tbl_no]))
        return FALSE;
      /* Update last_dc_val */
      state.cur.last_dc_val[ci] = MCU_data[blkn][0][0];
    }
  } else {
    for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
      ci = cinfo->MCU_membership[blkn];
      compptr = cinfo->cur_comp_info[ci];
      if (!encode_one_block(&state,
                            MCU_data[blkn][0], state.cur.last_dc_val[ci],
                            entropy->dc_derived_tbls[compptr->dc_tbl_no],
                            entropy->ac_derived_tbls[compptr->ac_tbl_no]))
        return FALSE;
      /* Update last_dc_val */
      state.cur.last_dc_val[ci] = MCU_data[blkn][0][0];
    }
  }

  /* Completed MCU, so update state */
  cinfo->dest->next_output_byte = state.next_output_byte;
  cinfo->dest->free_in_buffer = state.free_in_buffer;
  entropy->saved = state.cur;

  /* Update restart-interval state too */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  return TRUE;
}